

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O2

int vrna_E_ext_loop(vrna_fold_compound_t *fc,int i,int j)

{
  short *psVar1;
  vrna_param_t *p;
  int *piVar2;
  char *ptype;
  vrna_sc_t *pvVar3;
  uchar uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  vrna_callback_hc_evaluate *pvVar9;
  default_data hc_dat_local;
  
  psVar1 = (fc->field_23).field_0.sequence_encoding;
  p = fc->params;
  piVar2 = fc->jindx;
  ptype = (fc->field_23).field_0.ptype;
  pvVar3 = (fc->field_23).field_0.sc;
  pvVar9 = prepare_hc_default(fc,&hc_dat_local);
  uVar5 = vrna_get_ptype(piVar2[j] + i,ptype);
  uVar4 = (*pvVar9)(i,j,i,j,'\x0e',&hc_dat_local);
  if (uVar4 == '\0') {
    iVar6 = 10000000;
  }
  else {
    if ((p->model_details).dangles == 2) {
      iVar6 = vrna_E_ext_stem(uVar5,(int)psVar1[(long)i + -1],(int)psVar1[(long)j + 1],p);
    }
    else {
      iVar6 = 0;
      if (2 < uVar5) {
        iVar6 = p->TerminalAU;
      }
    }
    if ((pvVar3 != (vrna_sc_t *)0x0) && (pvVar3->f != (vrna_callback_sc_energy *)0x0)) {
      iVar7 = (*pvVar3->f)(i,j,i,j,'\x0e',pvVar3->data);
      iVar6 = iVar6 + iVar7;
    }
  }
  if (((p->model_details).dangles & 1) != 0) {
    iVar7 = piVar2[(long)j + -1];
    uVar4 = (*pvVar9)(i,j,i,j + -1,'\x0e',&hc_dat_local);
    if (uVar4 != '\0') {
      uVar5 = vrna_get_ptype(iVar7 + i,ptype);
      if ((long)psVar1[j] < 0) {
        iVar7 = 0;
      }
      else {
        iVar7 = p->dangle3[uVar5][psVar1[j]];
      }
      if (2 < uVar5) {
        iVar7 = iVar7 + p->TerminalAU;
      }
      if ((pvVar3 != (vrna_sc_t *)0x0) && (pvVar3->f != (vrna_callback_sc_energy *)0x0)) {
        iVar8 = (*pvVar3->f)(i,j,i,j + -1,'\x0e',pvVar3->data);
        iVar7 = iVar7 + iVar8;
      }
      if (iVar7 <= iVar6) {
        iVar6 = iVar7;
      }
    }
    iVar7 = piVar2[j];
    iVar8 = i + 1;
    uVar4 = (*pvVar9)(i,j,iVar8,j,'\x0e',&hc_dat_local);
    if (uVar4 != '\0') {
      uVar5 = vrna_get_ptype(iVar7 + iVar8,ptype);
      if ((long)psVar1[i] < 0) {
        iVar7 = 0;
      }
      else {
        iVar7 = p->dangle5[uVar5][psVar1[i]];
      }
      if (2 < uVar5) {
        iVar7 = iVar7 + p->TerminalAU;
      }
      if ((pvVar3 != (vrna_sc_t *)0x0) && (pvVar3->f != (vrna_callback_sc_energy *)0x0)) {
        iVar8 = (*pvVar3->f)(i,j,iVar8,j,'\x0e',pvVar3->data);
        iVar7 = iVar7 + iVar8;
      }
      if (iVar7 <= iVar6) {
        iVar6 = iVar7;
      }
    }
  }
  return iVar6;
}

Assistant:

PUBLIC int
vrna_E_ext_loop(vrna_fold_compound_t  *fc,
                int                   i,
                int                   j)
{
  char                      *ptype;
  short                     *S;
  unsigned int              type;
  int                       ij, en, e, *idx;
  vrna_param_t              *P;
  vrna_md_t                 *md;
  vrna_sc_t                 *sc;
  vrna_callback_hc_evaluate *evaluate;
  struct default_data       hc_dat_local;

  S         = fc->sequence_encoding;
  idx       = fc->jindx;
  ptype     = fc->ptype;
  P         = fc->params;
  md        = &(P->model_details);
  sc        = fc->sc;
  evaluate  = prepare_hc_default(fc, &hc_dat_local);

  e     = INF;
  ij    = idx[j] + i;
  type  = vrna_get_ptype(ij, ptype);

  if (evaluate(i, j, i, j, VRNA_DECOMP_EXT_STEM, &hc_dat_local)) {
    switch (md->dangles) {
      case 2:
        e = vrna_E_ext_stem(type, S[i - 1], S[j + 1], P);
        break;

      case 0:
      /* fall through */

      default:
        e = vrna_E_ext_stem(type, -1, -1, P);
        break;
    }
    if (sc)
      if (sc->f)
        e += sc->f(i, j, i, j, VRNA_DECOMP_EXT_STEM, sc->data);
  }

  if (md->dangles % 2) {
    ij = idx[j - 1] + i;
    if (evaluate(i, j, i, j - 1, VRNA_DECOMP_EXT_STEM, &hc_dat_local)) {
      type = vrna_get_ptype(ij, ptype);

      en = vrna_E_ext_stem(type, -1, S[j], P);

      if (sc)
        if (sc->f)
          en += sc->f(i, j, i, j - 1, VRNA_DECOMP_EXT_STEM, sc->data);

      e = MIN2(e, en);
    }

    ij = idx[j] + i + 1;
    if (evaluate(i, j, i + 1, j, VRNA_DECOMP_EXT_STEM, &hc_dat_local)) {
      type = vrna_get_ptype(ij, ptype);

      en = vrna_E_ext_stem(type, S[i], -1, P);

      if (sc)
        if (sc->f)
          en += sc->f(i, j, i + 1, j, VRNA_DECOMP_EXT_STEM, sc->data);

      e = MIN2(e, en);
    }
  }

  return e;
}